

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_soft_max_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *mask,float scale,float max_bias,
                  _Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  char *pcVar3;
  int line;
  char *file;
  
  _Var1 = ggml_is_contiguous_n(a,0);
  if (!_Var1) {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c";
    pcVar3 = "ggml_is_contiguous(a)";
    line = 0xd7f;
    goto LAB_0011c7cc;
  }
  if (mask == (ggml_tensor *)0x0) {
    if (0.0 < max_bias) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar3 = "mask";
      line = 0xd8a;
      goto LAB_0011c7cc;
    }
  }
  else {
    if (GGML_TYPE_F16 < mask->type) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar3 = "mask->type == GGML_TYPE_F16 || mask->type == GGML_TYPE_F32";
      line = 0xd82;
      goto LAB_0011c7cc;
    }
    _Var1 = ggml_is_contiguous_n(mask,0);
    if (!_Var1) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar3 = "ggml_is_contiguous(mask)";
      line = 0xd83;
      goto LAB_0011c7cc;
    }
    if ((mask->ne[2] != 1) || (mask->ne[3] != 1)) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar3 = "ggml_is_matrix(mask)";
      line = 0xd84;
      goto LAB_0011c7cc;
    }
    if (mask->ne[0] != a->ne[0]) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar3 = "mask->ne[0] == a->ne[0]";
      line = 0xd85;
      goto LAB_0011c7cc;
    }
    if (mask->ne[1] < a->ne[1]) {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar3 = "mask->ne[1] >= a->ne[1]";
      line = 0xd86;
      goto LAB_0011c7cc;
    }
  }
  if (inplace) {
    pgVar2 = ggml_view_tensor(ctx,a);
  }
  else {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
  }
  if (pgVar2 != (ggml_tensor *)0x0) {
    pgVar2->op_params[0] = (int32_t)scale;
    pgVar2->op_params[1] = (int32_t)max_bias;
    pgVar2->op = GGML_OP_SOFT_MAX;
    pgVar2->src[0] = a;
    pgVar2->src[1] = mask;
    return pgVar2;
  }
  file = 
  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-impl.h";
  pcVar3 = "tensor != NULL";
  line = 0x70;
LAB_0011c7cc:
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

static struct ggml_tensor * ggml_soft_max_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        bool                  inplace) {
    GGML_ASSERT(ggml_is_contiguous(a));

    if (mask) {
        GGML_ASSERT(mask->type == GGML_TYPE_F16 || mask->type == GGML_TYPE_F32);
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(ggml_is_matrix(mask));
        GGML_ASSERT(mask->ne[0] == a->ne[0]);
        GGML_ASSERT(mask->ne[1] >= a->ne[1]);
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    float params[] = { scale, max_bias };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_SOFT_MAX;
    result->src[0] = a;
    result->src[1] = mask;

    return result;
}